

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetSpecification.cpp
# Opt level: O2

bool Rml::StyleSheetSpecification::RegisterParser(String *parser_name,PropertyParser *parser)

{
  NodePtr pDVar1;
  type ppPVar2;
  iterator iVar3;
  
  iVar3 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::PropertyParser_*,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(instance,parser_name);
  pDVar1 = (NodePtr)instance->mInfo;
  if (iVar3.mKeyVals == pDVar1) {
    ppPVar2 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::doCreateByKey<std::__cxx11::string_const&,Rml::PropertyParser*>
                        ((Table<true,80ul,std::__cxx11::string,Rml::PropertyParser*,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)instance,parser_name);
    *ppPVar2 = parser;
  }
  else {
    Log::Message(LT_WARNING,"Parser with name %s already exists!",(parser_name->_M_dataplus)._M_p);
  }
  return iVar3.mKeyVals == pDVar1;
}

Assistant:

bool StyleSheetSpecification::RegisterParser(const String& parser_name, PropertyParser* parser)
{
	ParserMap::iterator iterator = instance->parsers.find(parser_name);
	if (iterator != instance->parsers.end())
	{
		Log::Message(Log::LT_WARNING, "Parser with name %s already exists!", parser_name.c_str());
		return false;
	}

	instance->parsers[parser_name] = parser;
	return true;
}